

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::DefaultReadCordTest_ReadLargeCord_Test::TestBody
          (DefaultReadCordTest_ReadLargeCord_Test *this)

{
  bool bVar1;
  int iVar2;
  void *data;
  char *pcVar3;
  char *in_R9;
  string_view src;
  AssertHelper local_148;
  Message local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  undefined1 local_118 [8];
  Cord expected;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  ArrayInputStream input;
  Cord dest;
  int i;
  allocator<char> local_31;
  string local_30 [8];
  string source;
  DefaultReadCordTest_ReadLargeCord_Test *this_local;
  
  source.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"abcdefghijk",&local_31);
  std::allocator<char>::~allocator(&local_31);
  for (dest.contents_.data_.rep_.field_0._8_4_ = 0;
      (int)dest.contents_.data_.rep_.field_0._8_4_ < 0x400;
      dest.contents_.data_.rep_.field_0._8_4_ = dest.contents_.data_.rep_.field_0._8_4_ + 1) {
    std::__cxx11::string::append((char *)local_30);
  }
  absl::lts_20250127::Cord::Cord((Cord *)&input.position_);
  data = (void *)std::__cxx11::string::data();
  iVar2 = std::__cxx11::string::size();
  ArrayInputStream::ArrayInputStream((ArrayInputStream *)&gtest_ar_.message_,data,iVar2,-1);
  local_89 = ArrayInputStream::Skip((ArrayInputStream *)&gtest_ar_.message_,1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_88,
               (AssertionResult *)"input.Skip(1)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x2e9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  iVar2 = std::__cxx11::string::size();
  local_d1 = ZeroCopyInputStream::ReadCord
                       ((ZeroCopyInputStream *)&gtest_ar_.message_,(Cord *)&input.position_,
                        iVar2 + -2);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&expected.contents_.data_.rep_.field_0 + 8),(internal *)local_d0,
               (AssertionResult *)"input.ReadCord(&dest, source.size() - 2)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x2ea,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)(expected.contents_.data_.rep_.field_0.data + 8));
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  src = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )src._M_len;
  absl::lts_20250127::Cord::Cord((Cord *)local_118,src);
  absl::lts_20250127::Cord::RemovePrefix((Cord *)local_118,1);
  absl::lts_20250127::Cord::RemoveSuffix((Cord *)local_118,1);
  testing::internal::EqHelper::Compare<absl::lts_20250127::Cord,_absl::lts_20250127::Cord,_nullptr>
            ((EqHelper *)local_138,"expected","dest",(Cord *)local_118,(Cord *)&input.position_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x2f0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  absl::lts_20250127::Cord::~Cord((Cord *)local_118);
  ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&gtest_ar_.message_);
  absl::lts_20250127::Cord::~Cord((Cord *)&input.position_);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(DefaultReadCordTest, ReadLargeCord) {
  std::string source = "abcdefghijk";
  for (int i = 0; i < 1024; i++) {
    source.append("abcdefghijk");
  }

  absl::Cord dest;
  ArrayInputStream input(source.data(), source.size());
  EXPECT_TRUE(input.Skip(1));
  EXPECT_TRUE(input.ReadCord(&dest, source.size() - 2));

  absl::Cord expected(source);
  expected.RemovePrefix(1);
  expected.RemoveSuffix(1);

  EXPECT_EQ(expected, dest);
}